

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONBuildPresets.cxx
# Opt level: O3

bool cmCMakePresetsGraphInternal::BuildPresetsHelper
               (vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::BuildPreset> *in_RCX;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  code *local_80;
  cmJSONState *local_78;
  Value *local_70;
  Object<cmCMakePresetsGraph::BuildPreset> local_68;
  
  if (BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*,cmJSONState*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      local_90 = 0;
      local_98 = cmCMakePresetsErrors::INVALID_PRESETS;
      local_80 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_88 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>::Object
                (&local_68,
                 (Object<cmCMakePresetsGraph::BuildPreset> *)
                 (anonymous_namespace)::BuildPresetHelper);
      cmJSONHelperBuilder::
      Vector<cmCMakePresetsGraph::BuildPreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>>
                (&BuildPresetsHelper::helper,(cmJSONHelperBuilder *)&local_98,
                 (ErrorGenerator *)&local_68,in_RCX);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>::~Object(&local_68);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      __cxa_atexit(std::_Function_base::~_Function_base,&BuildPresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  local_78 = state;
  local_70 = value;
  if (BuildPresetsHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*BuildPresetsHelper::helper._M_invoker)
                      ((_Any_data *)&BuildPresetsHelper::helper,out,&local_70,&local_78);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool BuildPresetsHelper(std::vector<BuildPreset>& out,
                        const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<BuildPreset>(
    cmCMakePresetsErrors::INVALID_PRESETS, BuildPresetHelper);

  return helper(out, value, state);
}